

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3OpenMasterTable(Parse *p,int iDb)

{
  Vdbe *p_00;
  char *zName;
  Vdbe *v;
  int iDb_local;
  Parse *p_local;
  
  p_00 = sqlite3GetVdbe(p);
  zName = "sqlite_master";
  if (iDb == 1) {
    zName = "sqlite_temp_master";
  }
  sqlite3TableLock(p,iDb,1,'\x01',zName);
  sqlite3VdbeAddOp3(p_00,0x28,0,1,iDb);
  sqlite3VdbeChangeP4(p_00,-1,(char *)0x5,-0xe);
  if (p->nTab == 0) {
    p->nTab = 1;
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3OpenMasterTable(Parse *p, int iDb){
  Vdbe *v = sqlite3GetVdbe(p);
  sqlite3TableLock(p, iDb, MASTER_ROOT, 1, SCHEMA_TABLE(iDb));
  sqlite3VdbeAddOp3(v, OP_OpenWrite, 0, MASTER_ROOT, iDb);
  sqlite3VdbeChangeP4(v, -1, (char *)5, P4_INT32);  /* 5 column table */
  if( p->nTab==0 ){
    p->nTab = 1;
  }
}